

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

void __thiscall ON_SHA1::AccumulateBoundingBox(ON_SHA1 *this,ON_BoundingBox *bbox)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double v;
  ulong local_28;
  
  bVar2 = ON_BoundingBox::IsSet(bbox);
  uVar3 = 0xfffffffffffffff8;
  if (bVar2) {
    do {
      dVar1 = *(double *)((long)&(bbox->m_min).y + uVar3);
      local_28 = ~-(ulong)(dVar1 == 0.0) & (ulong)dVar1;
      Internal_SwapBigEndianUpdate(this,&local_28,8);
      uVar3 = uVar3 + 8;
    } while (uVar3 < 0x10);
    uVar3 = 0xfffffffffffffff8;
    do {
      dVar1 = *(double *)((long)&(bbox->m_max).y + uVar3);
      local_28 = ~-(ulong)(dVar1 == 0.0) & (ulong)dVar1;
      Internal_SwapBigEndianUpdate(this,&local_28,8);
      uVar3 = uVar3 + 8;
    } while (uVar3 < 0x10);
  }
  else {
    do {
      dVar1 = *(double *)((long)&ON_BoundingBox::UnsetBoundingBox.m_min.y + uVar3);
      local_28 = ~-(ulong)(dVar1 == 0.0) & (ulong)dVar1;
      Internal_SwapBigEndianUpdate(this,&local_28,8);
      uVar3 = uVar3 + 8;
    } while (uVar3 < 0x10);
    uVar3 = 0xfffffffffffffff8;
    do {
      dVar1 = *(double *)((long)&ON_BoundingBox::UnsetBoundingBox.m_max.y + uVar3);
      local_28 = ~-(ulong)(dVar1 == 0.0) & (ulong)dVar1;
      Internal_SwapBigEndianUpdate(this,&local_28,8);
      uVar3 = uVar3 + 8;
    } while (uVar3 < 0x10);
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateBoundingBox(
  const class ON_BoundingBox& bbox
)
{
  if (bbox.IsSet())
  {
    Accumulate3dPoint(bbox.m_min);
    Accumulate3dPoint(bbox.m_max);
  }
  else
  {
    Accumulate3dPoint(ON_BoundingBox::UnsetBoundingBox.m_min);
    Accumulate3dPoint(ON_BoundingBox::UnsetBoundingBox.m_max);
  }
}